

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcGenTarg::build_synthesized_code(CTcGenTarg *this)

{
  tc_symtype_t tVar1;
  CTcSymFunc *this_00;
  mmstub_ctx ctx;
  CTcSymFunc *in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  mmstub_ctx::mmstub_ctx((mmstub_ctx *)&stack0xffffffffffffffe8);
  CTcParser::get_global_symtab(G_prs);
  this_00 = (CTcSymFunc *)
            CTcPrsSymtab::find((CTcPrsSymtab *)
                               CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                               (textchar_t *)in_stack_ffffffffffffffe8,0x223544);
  CTcDataStream::set_object_file_start_ofs(&G_cs_static->super_CTcDataStream);
  CTcDataStream::set_object_file_start_ofs(G_os);
  CTcParser::get_global_symtab(G_prs);
  CTcPrsSymtab::enum_entries
            ((CTcPrsSymtab *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             (_func_void_void_ptr_CTcSymbol_ptr *)this_00,(void *)0x223587);
  if (in_stack_fffffffffffffff0 != 0) {
    if ((this_00 != (CTcSymFunc *)0x0) &&
       (tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_00), tVar1 == TC_SYM_FUNC)) {
      return;
    }
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e32,"_multiMethodCall");
  }
  return;
}

Assistant:

void CTcGenTarg::build_synthesized_code()
{
    mmstub_ctx ctx;
    
    /* look up the _multiMethodCall function */
    ctx.mmc = (CTcSymFunc *)G_prs->get_global_symtab()->find(
        "_multiMethodCall", 16);

    /* 
     *   our generated code isn't part of any object file - flag a new object
     *   file so that we don't get confused into thinking this came from the
     *   last object file loaded 
     */
    G_cs_static->set_object_file_start_ofs();
    G_os->set_object_file_start_ofs();

    /* build out the stubs for the multi-method base functions */
    G_prs->get_global_symtab()->enum_entries(&multimethod_stub_cb, &ctx);

    /* 
     *   if we generated any stubs, we definitely need _multiMethodCall to be
     *   defined - if it's not, it's an error 
     */
    if (ctx.cnt != 0 && (ctx.mmc == 0 || ctx.mmc->get_type() != TC_SYM_FUNC))
    {
        G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_MISSING_MMREG,
                            "_multiMethodCall");
    }
}